

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O2

UBool __thiscall
icu_63::OlsonTimeZone::getNextTransition
          (OlsonTimeZone *this,UDate base,UBool inclusive,TimeZoneTransition *result)

{
  TimeArrayTimeZoneRule *this_00;
  TimeArrayTimeZoneRule *this_01;
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TimeZoneTransition *right;
  short transIdx;
  int iVar4;
  int iVar5;
  UDate UVar6;
  double dVar7;
  UErrorCode status;
  UnicodeString toName;
  UnicodeString fromName;
  UErrorCode local_b4;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_b4 = U_ZERO_ERROR;
  checkTransitionRules(this,&local_b4);
  if (U_ZERO_ERROR < local_b4) {
    return '\0';
  }
  if (this->finalZone != (SimpleTimeZone *)0x0) {
    if (inclusive != '\0') {
      UVar6 = TimeZoneTransition::getTime(this->firstFinalTZTransition);
      if ((UVar6 == base) && (!NAN(UVar6) && !NAN(base))) {
        right = this->firstFinalTZTransition;
        goto LAB_00201956;
      }
    }
    UVar6 = TimeZoneTransition::getTime(this->firstFinalTZTransition);
    if (UVar6 <= base) {
      iVar4 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[9]
              )();
      if ((char)iVar4 == '\0') {
        return '\0';
      }
      iVar4 = (*(this->finalZoneWithStartYear->super_BasicTimeZone).super_TimeZone.super_UObject.
                _vptr_UObject[0xe])
                        (base,this->finalZoneWithStartYear,(ulong)(uint)(int)inclusive,result);
      return (UBool)iVar4;
    }
  }
  if (this->historicRules == (TimeArrayTimeZoneRule **)0x0) {
    return '\0';
  }
  iVar5 = (short)(this->transitionCount32 + this->transitionCountPre32 + this->transitionCountPost32
                 ) + -1;
  iVar4 = iVar5;
  while( true ) {
    transIdx = (short)iVar4;
    if (transIdx < this->firstTZTransitionIdx) break;
    dVar7 = transitionTime(this,transIdx);
    if ((dVar7 < base) || (inclusive == '\0' && dVar7 == base)) break;
    iVar4 = iVar4 + -1;
  }
  if (iVar5 == transIdx) {
    right = this->firstFinalTZTransition;
    if (right == (TimeZoneTransition *)0x0) {
      return '\0';
    }
LAB_00201956:
    TimeZoneTransition::operator=(result,right);
    return '\x01';
  }
  if (transIdx < this->firstTZTransitionIdx) {
    right = this->firstTZTransition;
    goto LAB_00201956;
  }
  this_00 = this->historicRules[this->typeMapData[(long)transIdx + 1]];
  this_01 = this->historicRules[this->typeMapData[transIdx]];
  dVar7 = transitionTime(this,transIdx + 1);
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4bf0;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4bf0;
  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
  TimeZoneRule::getName(&this_01->super_TimeZoneRule,&local_70);
  TimeZoneRule::getName(&this_00->super_TimeZoneRule,&local_b0);
  UVar1 = UnicodeString::operator==(&local_70,&local_b0);
  if (UVar1 != '\0') {
    iVar2 = TimeZoneRule::getRawOffset(&this_01->super_TimeZoneRule);
    iVar3 = TimeZoneRule::getRawOffset(&this_00->super_TimeZoneRule);
    if (iVar2 == iVar3) {
      iVar2 = TimeZoneRule::getDSTSavings(&this_01->super_TimeZoneRule);
      iVar3 = TimeZoneRule::getDSTSavings(&this_00->super_TimeZoneRule);
      if (iVar2 == iVar3) {
        iVar4 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0xe])
                          (dVar7,this,0,result);
        UVar1 = (UBool)iVar4;
        goto LAB_00201a60;
      }
    }
  }
  TimeZoneTransition::setTime(result,dVar7);
  iVar4 = (*(this_01->super_TimeZoneRule).super_UObject._vptr_UObject[3])(this_01);
  TimeZoneTransition::adoptFrom(result,(TimeZoneRule *)CONCAT44(extraout_var,iVar4));
  iVar4 = (*(this_00->super_TimeZoneRule).super_UObject._vptr_UObject[3])(this_00);
  UVar1 = '\x01';
  TimeZoneTransition::adoptTo(result,(TimeZoneRule *)CONCAT44(extraout_var_00,iVar4));
LAB_00201a60:
  UnicodeString::~UnicodeString(&local_b0);
  UnicodeString::~UnicodeString(&local_70);
  return UVar1;
}

Assistant:

UBool
OlsonTimeZone::getNextTransition(UDate base, UBool inclusive, TimeZoneTransition& result) const {
    UErrorCode status = U_ZERO_ERROR;
    checkTransitionRules(status);
    if (U_FAILURE(status)) {
        return FALSE;
    }

    if (finalZone != NULL) {
        if (inclusive && base == firstFinalTZTransition->getTime()) {
            result = *firstFinalTZTransition;
            return TRUE;
        } else if (base >= firstFinalTZTransition->getTime()) {
            if (finalZone->useDaylightTime()) {
                //return finalZone->getNextTransition(base, inclusive, result);
                return finalZoneWithStartYear->getNextTransition(base, inclusive, result);
            } else {
                // No more transitions
                return FALSE;
            }
        }
    }
    if (historicRules != NULL) {
        // Find a historical transition
        int16_t transCount = transitionCount();
        int16_t ttidx = transCount - 1;
        for (; ttidx >= firstTZTransitionIdx; ttidx--) {
            UDate t = (UDate)transitionTime(ttidx);
            if (base > t || (!inclusive && base == t)) {
                break;
            }
        }
        if (ttidx == transCount - 1)  {
            if (firstFinalTZTransition != NULL) {
                result = *firstFinalTZTransition;
                return TRUE;
            } else {
                return FALSE;
            }
        } else if (ttidx < firstTZTransitionIdx) {
            result = *firstTZTransition;
            return TRUE;
        } else {
            // Create a TimeZoneTransition
            TimeZoneRule *to = historicRules[typeMapData[ttidx + 1]];
            TimeZoneRule *from = historicRules[typeMapData[ttidx]];
            UDate startTime = (UDate)transitionTime(ttidx+1);

            // The transitions loaded from zoneinfo.res may contain non-transition data
            UnicodeString fromName, toName;
            from->getName(fromName);
            to->getName(toName);
            if (fromName == toName && from->getRawOffset() == to->getRawOffset()
                    && from->getDSTSavings() == to->getDSTSavings()) {
                return getNextTransition(startTime, false, result);
            }
            result.setTime(startTime);
            result.adoptFrom(from->clone());
            result.adoptTo(to->clone());
            return TRUE;
        }
    }
    return FALSE;
}